

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryWaitableObject::EnsureObjectIsShared
          (CSharedMemoryWaitableObject *this,CPalThread *pthr)

{
  DWORD DVar1;
  VOID *local_40;
  VOID *pvSharedSynchData;
  SHMObjData *psmod;
  SHMPTR shmObjData;
  IDataLock *pDataLock;
  CPalThread *pCStack_18;
  PAL_ERROR palError;
  CPalThread *pthr_local;
  CSharedMemoryWaitableObject *this_local;
  
  pDataLock._4_4_ = 0;
  shmObjData = 0;
  psmod = (SHMObjData *)0x0;
  pCStack_18 = pthr;
  pthr_local = (CPalThread *)this;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","EnsureObjectIsShared",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x4b3);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  (**(code **)(*g_pSynchronizationManager + 0x50))(g_pSynchronizationManager,pCStack_18);
  if ((this->super_CSharedMemoryObject).m_ObjectDomain != SharedObject) {
    SHMLock();
    DVar1 = CObjectType::GetSharedDataSize
                      ((this->super_CSharedMemoryObject).super_CPalObjectBase.m_pot);
    if (DVar1 != 0) {
      CSimpleDataLock::AcquireLock
                (&(this->super_CSharedMemoryObject).m_sdlSharedData,pCStack_18,
                 (IDataLock **)&shmObjData);
    }
    pDataLock._4_4_ =
         CSharedMemoryObject::AllocateSharedDataItems
                   (&this->super_CSharedMemoryObject,(SHMPTR *)&psmod,
                    (SHMObjData **)&pvSharedSynchData);
    if ((pDataLock._4_4_ == 0) &&
       (pDataLock._4_4_ =
             (**(code **)(*g_pSynchronizationManager + 0x48))
                       (g_pSynchronizationManager,pCStack_18,this->m_pvSynchData,&local_40),
       pDataLock._4_4_ == 0)) {
      this->m_pvSynchData = local_40;
      *(VOID **)((long)pvSharedSynchData + 0x40) = local_40;
      CSharedMemoryObject::PromoteSharedData
                (&this->super_CSharedMemoryObject,(SHMPTR)psmod,(SHMObjData *)pvSharedSynchData);
      (this->super_CSharedMemoryObject).m_ObjectDomain = SharedObject;
    }
    if (shmObjData != 0) {
      (*(code *)**(undefined8 **)shmObjData)(shmObjData,pCStack_18,1);
    }
    SHMRelease();
  }
  (**(code **)(*g_pSynchronizationManager + 0x58))(g_pSynchronizationManager,pCStack_18);
  if ((pDataLock._4_4_ != 0) && (psmod != (SHMObjData *)0x0)) {
    CSharedMemoryObject::FreeSharedDataAreas((SHMPTR)psmod);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return pDataLock._4_4_;
  }
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryWaitableObject::EnsureObjectIsShared(
    CPalThread *pthr
    )
{
    PAL_ERROR palError = NO_ERROR;
    IDataLock *pDataLock = NULL;
    SHMPTR shmObjData = SHMNULL;
    SHMObjData *psmod;
    VOID *pvSharedSynchData;

    _ASSERTE(NULL != pthr);

    ENTRY("CSharedMemoryWaitableObject::EnsureObjectIsShared"
        "(this = %p, pthr = %p)\n",
        this,
        pthr
        );
    
    //
    // First, grab the process synchronization lock and check
    // if the object is already shared
    //

    g_pSynchronizationManager->AcquireProcessLock(pthr);

    if (SharedObject == m_ObjectDomain)
    {
        goto EnsureObjectIsSharedExitNoSHMLockRelease;
    }

    //
    // Grab the necessary locks
    //

    SHMLock();

    if (0 != m_pot->GetSharedDataSize())
    {
        m_sdlSharedData.AcquireLock(pthr, &pDataLock);
    }

    //
    // Allocate the necessary shared data areas
    //

    palError = AllocateSharedDataItems(&shmObjData, &psmod);
    if (NO_ERROR != palError)
    {
        goto EnsureObjectIsSharedExit;
    }

    //
    // Promote the object's synchronization data
    //

    palError = g_pSynchronizationManager->PromoteObjectSynchData(
        pthr,
        m_pvSynchData,
        &pvSharedSynchData
        );

    if (NO_ERROR != palError)
    {
        goto EnsureObjectIsSharedExit;
    }

    m_pvSynchData = pvSharedSynchData;
    psmod->pvSynchData = pvSharedSynchData;

    //
    // Promote the object's data and set the domain to shared
    //

    PromoteSharedData(shmObjData, psmod);
    m_ObjectDomain = SharedObject;

EnsureObjectIsSharedExit:

    if (NULL != pDataLock)
    {
        pDataLock->ReleaseLock(pthr, TRUE);
    }

    SHMRelease();

EnsureObjectIsSharedExitNoSHMLockRelease:

    g_pSynchronizationManager->ReleaseProcessLock(pthr);

    if (NO_ERROR != palError && SHMNULL != shmObjData)
    {
        //
        // Since shmObjdData is local to this function there's no
        // need to continue to hold the promotion locks when
        // freeing the allocated data on error
        //
        
        FreeSharedDataAreas(shmObjData);
    }

    LOGEXIT("CSharedMemoryWaitableObject::EnsureObjectIsShared returns %d\n",
        palError
        );

    return palError;
}